

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.hpp
# Opt level: O3

EquationSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>
* __thiscall
QuadraticSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
::SolveImpl(EquationSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>
            *__return_storage_ptr__,
           QuadraticSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
           *this,Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                 *polynome)

{
  pointer pnVar1;
  pointer pnVar2;
  EquationSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>
  *pEVar3;
  int iVar4;
  initializer_list<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  __l;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  sqrt_d;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  d;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  x2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  x1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  a2;
  allocator_type local_291;
  EquationSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>
  *local_290;
  cpp_dec_float<100U,_int,_void> local_288;
  cpp_dec_float<100U,_int,_void> local_238;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  local_1e8;
  undefined1 local_1c8 [16];
  number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
  *local_1b8;
  pointer pnStack_1b0;
  pointer local_1a8;
  uint auStack_1a0 [2];
  uint local_198 [2];
  uint auStack_190 [2];
  int local_188;
  bool local_184;
  fpclass_type local_180;
  int32_t iStack_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined4 local_138;
  undefined1 local_134;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined5 uStack_f0;
  undefined3 uStack_eb;
  undefined4 uStack_e8;
  undefined1 uStack_e4;
  undefined8 local_e0;
  type local_d8;
  type pnStack_d0;
  type local_c8;
  type pnStack_c0;
  type local_b8;
  uint auStack_b0 [4];
  undefined5 uStack_a0;
  undefined3 uStack_9b;
  int iStack_98;
  undefined1 uStack_94;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined5 uStack_50;
  undefined3 uStack_4b;
  undefined5 uStack_48;
  undefined8 local_40;
  
  local_1a8 = (polynome->coeffs).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pnVar2 = local_1a8 + 2;
  pnVar1 = local_1a8 + 1;
  local_1b8 = (number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
               *)CONCAT44(local_1b8._4_4_,4);
  local_238.fpclass = cpp_dec_float_finite;
  local_238.prec_elem = 0x10;
  local_238.data._M_elems[0] = 0;
  local_238.data._M_elems[1] = 0;
  local_238.data._M_elems[2] = 0;
  local_238.data._M_elems[3] = 0;
  local_238.data._M_elems[4] = 0;
  local_238.data._M_elems[5] = 0;
  local_238.data._M_elems[6] = 0;
  local_238.data._M_elems[7] = 0;
  local_238.data._M_elems[8] = 0;
  local_238.data._M_elems[9] = 0;
  local_238.data._M_elems[10] = 0;
  local_238.data._M_elems[0xb] = 0;
  local_238.data._M_elems[0xc] = 0;
  local_238.data._M_elems[0xd] = 0;
  local_238.data._M_elems._56_5_ = 0;
  local_238.data._M_elems[0xf]._1_3_ = 0;
  local_238.exp = 0;
  local_238.neg = false;
  local_1c8._0_8_ = pnVar1;
  local_1c8._8_8_ = pnVar1;
  pnStack_1b0 = pnVar2;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
  ::
  do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::minus,boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>,boost::multiprecision::detail::expression<boost::multiprecision::detail::multiplies,boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>,void,void>>
            ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
              *)&local_238,
             (expression<boost::multiprecision::detail::minus,_boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_boost::multiprecision::detail::expression<boost::multiprecision::detail::multiplies,_boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_void,_void>
              *)local_1c8,(minus *)&local_288);
  local_288.fpclass = cpp_dec_float_NaN;
  if (local_238.fpclass != cpp_dec_float_NaN) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<100U,_int,_void> *)local_1c8,0,(type *)0x0);
    iVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                      (&local_238,(cpp_dec_float<100U,_int,_void> *)local_1c8);
    if (iVar4 < 0) {
      *(undefined4 *)
       &(__return_storage_ptr__->
        super__Variant_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_SpecificSolution>
        ).
        super__Move_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
        .
        super__Copy_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
        .
        super__Move_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
        .
        super__Copy_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
        .
        super__Variant_storage_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
        ._M_u = 0;
      (__return_storage_ptr__->
      super__Variant_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_SpecificSolution>
      ).
      super__Move_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
      .
      super__Copy_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
      .
      super__Move_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
      .
      super__Copy_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
      .
      super__Variant_storage_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
      ._M_index = '\x01';
      return __return_storage_ptr__;
    }
    local_288.fpclass = local_238.fpclass;
  }
  local_288.data._M_elems[0xf]._1_3_ = local_238.data._M_elems[0xf]._1_3_;
  local_288.data._M_elems._56_5_ = local_238.data._M_elems._56_5_;
  local_288.data._M_elems[0xc] = local_238.data._M_elems[0xc];
  local_288.data._M_elems[0xd] = local_238.data._M_elems[0xd];
  local_288.data._M_elems[8] = local_238.data._M_elems[8];
  local_288.data._M_elems[9] = local_238.data._M_elems[9];
  local_288.data._M_elems[10] = local_238.data._M_elems[10];
  local_288.data._M_elems[0xb] = local_238.data._M_elems[0xb];
  local_288.data._M_elems[4] = local_238.data._M_elems[4];
  local_288.data._M_elems[5] = local_238.data._M_elems[5];
  local_288.data._M_elems[6] = local_238.data._M_elems[6];
  local_288.data._M_elems[7] = local_238.data._M_elems[7];
  local_288.data._M_elems[0] = local_238.data._M_elems[0];
  local_288.data._M_elems[1] = local_238.data._M_elems[1];
  local_288.data._M_elems[2] = local_238.data._M_elems[2];
  local_288.data._M_elems[3] = local_238.data._M_elems[3];
  local_288.exp = local_238.exp;
  local_288.neg = local_238.neg;
  local_288.prec_elem = local_238.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::calculate_sqrt(&local_288);
  local_1c8._0_4_ = 2;
  local_40 = 0x1000000000;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  uStack_4b = 0;
  uStack_48 = 0;
  local_290 = __return_storage_ptr__;
  local_1c8._8_8_ = pnVar2;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
  ::
  do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
            ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
              *)&local_88,
             (expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
              *)local_1c8,(multiply_immediates *)&local_d8);
  local_1c8._0_8_ = &local_288;
  local_90._0_4_ = cpp_dec_float_finite;
  local_90._4_4_ = 0x10;
  local_d8 = (type)0x0;
  pnStack_d0 = (type)0x0;
  local_c8 = (type)0x0;
  pnStack_c0 = (type)0x0;
  local_b8 = (type)0x0;
  auStack_b0[0] = 0;
  auStack_b0[1] = 0;
  auStack_b0[2] = 0;
  auStack_b0[3] = 0;
  uStack_a0 = 0;
  uStack_9b = 0;
  iStack_98 = 0;
  uStack_94 = 0;
  local_1c8._8_8_ = pnVar1;
  local_1b8 = (number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
               *)&local_88;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
  ::
  do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::divides,boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
            ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
              *)&local_d8,
             (expression<boost::multiprecision::detail::divides,_boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
              *)local_1c8,(divides *)&local_128);
  pEVar3 = local_290;
  local_1c8._0_8_ = &local_288;
  local_e0 = 0x1000000000;
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  uStack_eb = 0;
  uStack_e8 = 0;
  uStack_e4 = 0;
  local_1c8._8_8_ = pnVar1;
  local_1b8 = (number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
               *)&local_88;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
  ::
  do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::negate,boost::multiprecision::detail::expression<boost::multiprecision::detail::divides,boost::multiprecision::detail::expression<boost::multiprecision::detail::add_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>,void,void,void>>
            ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
              *)&local_128,
             (expression<boost::multiprecision::detail::negate,_boost::multiprecision::detail::expression<boost::multiprecision::detail::divides,_boost::multiprecision::detail::expression<boost::multiprecision::detail::add_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_void,_void,_void>
              *)local_1c8,(negate *)&local_1e8);
  auStack_190[1]._1_3_ = uStack_9b;
  auStack_190._0_5_ = uStack_a0;
  local_198[0] = auStack_b0[2];
  local_198[1] = auStack_b0[3];
  local_1a8 = local_b8;
  auStack_1a0[0] = auStack_b0[0];
  auStack_1a0[1] = auStack_b0[1];
  local_1b8 = (number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
               *)local_c8;
  pnStack_1b0 = pnStack_c0;
  local_1c8._0_8_ = local_d8;
  local_1c8._8_8_ = pnStack_d0;
  local_188 = iStack_98;
  local_184 = (bool)uStack_94;
  local_180 = (fpclass_type)local_90;
  iStack_17c = local_90._4_4_;
  uStack_140 = CONCAT35(uStack_eb,uStack_f0);
  local_178 = local_128;
  uStack_170 = uStack_120;
  local_168 = local_118;
  uStack_160 = uStack_110;
  local_158 = local_108;
  uStack_150 = uStack_100;
  local_148 = local_f8;
  local_138 = uStack_e8;
  local_134 = uStack_e4;
  local_130 = local_e0;
  __l._M_len = 2;
  __l._M_array = (iterator)local_1c8;
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::vector(&local_1e8,__l,&local_291);
  *(pointer *)
   &(pEVar3->
    super__Variant_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_SpecificSolution>
    ).
    super__Move_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
    .
    super__Copy_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
    .
    super__Move_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
    .
    super__Copy_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
    .
    super__Variant_storage_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
    ._M_u = local_1e8.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(pEVar3->
           super__Variant_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_SpecificSolution>
           ).
           super__Move_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
           .
           super__Copy_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
           .
           super__Move_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
           .
           super__Copy_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
           .
           super__Variant_storage_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
           ._M_u + 8) =
       local_1e8.
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(pEVar3->
           super__Variant_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_SpecificSolution>
           ).
           super__Move_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
           .
           super__Copy_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
           .
           super__Move_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
           .
           super__Copy_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
           .
           super__Variant_storage_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
           ._M_u + 0x10) =
       local_1e8.
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pEVar3->
  super__Variant_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_SpecificSolution>
  ).
  super__Move_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
  .
  super__Copy_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
  .
  super__Move_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
  .
  super__Copy_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
  .
  super__Variant_storage_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
  ._M_index = '\0';
  return pEVar3;
}

Assistant:

EquationSolution<ValueType> SolveImpl(const Polynome<ValueType> &polynome) const override {
        const ValueType &a = polynome.A();
        const ValueType &b = polynome.B();
        const ValueType &c = polynome.C();
        
        ValueType d = b * b - 4 * a * c;
        if (d < 0) {
            return SpecificSolution::kNoRoots;
        }
        
        //ValueType sqrt_d = std::sqrt(static_cast<double>(d));
        ValueType sqrt_d = SqrtImpl(d);
        //todo optimize
        ValueType a2 = 2 * a;
        ValueType x1 = (-b + sqrt_d) / a2;
        ValueType x2 = (-b - sqrt_d) / a2;
        
        return std::vector<ValueType>({x1, x2});
    }